

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall DebugLogHelper::check_found(DebugLogHelper *this)

{
  bool bVar1;
  Logger *this_00;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  noui_reconnect();
  this_00 = LogInstance();
  BCLog::Logger::DeleteCallback(this_00,(this->m_print_connection)._M_node);
  if (this->m_found == false) {
    local_40._M_dataplus._M_p = (pointer)0x0;
    if ((this->m_match).super__Function_base._M_manager == (_Manager_type)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00842897;
      std::__throw_bad_function_call();
    }
    else {
      bVar1 = (*(this->m_match)._M_invoker)
                        ((_Any_data *)&this->m_match,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         &local_40);
      if (!bVar1) goto LAB_008427b5;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_40,(tinyformat *)"\'%s\' not found in debug log\n",(char *)this,in_RCX);
    std::runtime_error::runtime_error(this_01,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
LAB_008427b5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
LAB_00842897:
  __stack_chk_fail();
}

Assistant:

void DebugLogHelper::check_found()
{
    noui_reconnect();
    LogInstance().DeleteCallback(m_print_connection);
    if (!m_found && m_match(nullptr)) {
        throw std::runtime_error(strprintf("'%s' not found in debug log\n", m_message));
    }
}